

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  string ver;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  cmStrCat<std::__cxx11::string&,char_const(&)[9]>(&ver,&this->Name,(char (*) [9])0x7a1e2b);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:2590:24)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:2590:24)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionFoundPatch,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_30,&ver,&this->VersionFound,this->VersionFoundCount,
                      this->VersionFoundMajor,this->VersionFoundMinor,this->VersionFoundPatch,
                      this->VersionFoundTweak);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  if ((this->VersionFound)._M_string_length == 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,&ver);
  }
  std::__cxx11::string::~string((string *)&ver);
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string const ver = cmStrCat(this->Name, "_VERSION");
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };

  this->SetVersionVariables(addDefinition, ver, this->VersionFound,
                            this->VersionFoundCount, this->VersionFoundMajor,
                            this->VersionFoundMinor, this->VersionFoundPatch,
                            this->VersionFoundTweak);

  if (this->VersionFound.empty()) {
    this->Makefile->RemoveDefinition(ver);
  }
}